

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

double Util::JulianDateNatural2JD
                 (double year,double month,double day,double hour,double min,double sec)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double JD;
  double term4;
  double term3;
  double term2;
  double term1;
  
  dVar1 = floor((in_XMM1_Qa + 9.0) / 12.0);
  dVar2 = floor((in_XMM1_Qa * 275.0) / 9.0);
  dVar1 = floor(((in_XMM0_Qa + dVar1) * 7.0) / 4.0);
  return (in_XMM0_Qa * 367.0 - dVar1) + dVar2 + in_XMM2_Qa + 1721013.5 +
         ((in_XMM5_Qa / 60.0 + in_XMM4_Qa) / 60.0 + in_XMM3_Qa) / 24.0;
}

Assistant:

double JulianDateNatural2JD(double year, double month, double day, double hour, double min, double sec){

		double term1 = 367.0*year;
		double term2 = floor((month + 9.0)/12.0);
		double term3 = floor(275.0*month/9.0);
		double term4 = ((sec/60.0 + min)/60.0 + hour)/24.0;

		double JD = term1 - floor(7.0*(year + term2)/4.0) + term3 + day + 1721013.5 + term4;

		return JD;
	}